

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::DescriptorProto::SharedDtor(MessageLite *self)

{
  MessageOptions *this;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  DescriptorProto *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (DescriptorProto *)self;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  pAVar1 = MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[0xd]._internal_metadata_);
    this = (MessageOptions *)local_18[0xe]._vptr_MessageLite;
    if (this != (MessageOptions *)0x0) {
      MessageOptions::~MessageOptions(this);
      operator_delete(this,0x58);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0xf69,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void DescriptorProto::SharedDtor(MessageLite& self) {
  DescriptorProto& this_ = static_cast<DescriptorProto&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  delete this_._impl_.options_;
  this_._impl_.~Impl_();
}